

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::student_t_dist<double>::pdf(student_t_dist<double> *this,result_type_conflict2 x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = lgamma((double)((this->P).nu_ + 1) * 0.5);
  dVar3 = lgamma((double)(this->P).nu_ * 0.5);
  dVar2 = exp(dVar2 - dVar3);
  dVar3 = (double)(this->P).nu_ * 3.141592653589793;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  iVar1 = (this->P).nu_;
  dVar4 = pow((x * x) / (double)iVar1 + 1.0,(double)(iVar1 + 1) * -0.5);
  return dVar4 * (dVar2 / dVar3);
}

Assistant:

pdf(result_type x) const {
      const result_type norm{math::exp(math::ln_Gamma((P.nu() + 1) / result_type(2)) -
                                       math::ln_Gamma(P.nu() / result_type(2))) /
                             math::sqrt(math::constants<result_type>::pi * P.nu())};
      return norm * math::pow(1 + x * x / P.nu(), (P.nu() + 1) / result_type(-2));
    }